

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_shift_right(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  size_t sVar2;
  size_t sVar3;
  size_t s;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uStack_30;
  
  lVar4 = 0;
  lVar5 = 0;
  s = 0;
  while( true ) {
    if (s == 0x100) {
      return;
    }
    bitset = bitset_create();
    for (lVar6 = 300; lVar6 != 0x3bc4; lVar6 = lVar6 + 3) {
      bitset_set(bitset,lVar6 + lVar5);
    }
    sVar2 = bitset_count(bitset);
    bitset_shift_right(bitset,s);
    sVar3 = bitset_count(bitset);
    if (sVar3 != sVar2) break;
    lVar6 = 300;
    while (lVar6 + 3 != 0x3bc7) {
      _Var1 = bitset_get(bitset,lVar6 + lVar4);
      lVar6 = lVar6 + 3;
      if (!_Var1) {
        uStack_30 = 0x6f;
        goto LAB_00101785;
      }
    }
    bitset_free(bitset);
    s = s + 1;
    lVar5 = lVar5 + 3;
    lVar4 = lVar4 + 2;
  }
  uStack_30 = 0x6d;
LAB_00101785:
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_shift_right",uStack_30);
  exit(1);
}

Assistant:

void test_shift_right() {
  for (size_t sh = 0; sh < 256; sh++) {
    bitset_t *b = bitset_create();
    int power = 3;
    size_t s1 = 100 + sh;
    size_t s2 = s1 + 5000;
    for (size_t k = s1; k < s2; ++k) {
      bitset_set(b, power * k);
    }
    size_t mycount = bitset_count(b);
    bitset_shift_right(b, sh);
    TEST_ASSERT(bitset_count(b) == mycount);
    for (size_t k = s1; k < s2; ++k) {
      TEST_ASSERT(bitset_get(b, power * k - sh));
    }
    bitset_free(b);
  }
}